

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O1

QColor __thiscall QFusionStylePrivate::tabFrameColor(QFusionStylePrivate *this,QPalette *pal)

{
  long *plVar1;
  undefined8 uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QColor QVar4;
  undefined1 auVar5 [16];
  undefined8 local_28;
  undefined4 local_20;
  undefined2 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = (long *)QPalette::brush((ColorGroup)pal,Dark);
  if (*(int *)(*plVar1 + 4) == 0x18) {
    uVar3 = 0xffffffff;
    uVar2 = 0xffff080800000001;
  }
  else {
    QVar4 = buttonColor(this,pal);
    local_28 = QVar4._0_8_;
    local_20 = QVar4.ct._4_4_;
    local_1c = QVar4.ct._8_2_;
    auVar5 = QColor::lighter((int)&local_28);
    uVar2 = auVar5._0_8_;
    uVar3 = auVar5._8_8_ & 0xffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar4._8_8_ = uVar3;
    QVar4._0_8_ = uVar2;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QColor tabFrameColor(const QPalette &pal) const {
        if (pal.window().style() == Qt::TexturePattern)
            return QColor(255, 255, 255, 8);
        return buttonColor(pal).lighter(104);
    }